

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O2

unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
 __thiscall
draco::SequentialAttributeDecodersController::CreateSequentialDecoder
          (SequentialAttributeDecodersController *this,uint8_t decoder_type)

{
  SequentialQuantizationAttributeDecoder *this_00;
  undefined4 in_EDX;
  
  switch(in_EDX) {
  case 0:
    this_00 = (SequentialQuantizationAttributeDecoder *)operator_new(0x28);
    SequentialAttributeDecoder::SequentialAttributeDecoder((SequentialAttributeDecoder *)this_00);
    break;
  case 1:
    this_00 = (SequentialQuantizationAttributeDecoder *)operator_new(0x30);
    SequentialIntegerAttributeDecoder::SequentialIntegerAttributeDecoder
              ((SequentialIntegerAttributeDecoder *)this_00);
    break;
  case 2:
    this_00 = (SequentialQuantizationAttributeDecoder *)operator_new(0x60);
    SequentialQuantizationAttributeDecoder::SequentialQuantizationAttributeDecoder(this_00);
    break;
  case 3:
    this_00 = (SequentialQuantizationAttributeDecoder *)operator_new(0x40);
    SequentialNormalAttributeDecoder::SequentialNormalAttributeDecoder
              ((SequentialNormalAttributeDecoder *)this_00);
    break;
  default:
    this_00 = (SequentialQuantizationAttributeDecoder *)0x0;
  }
  (this->super_AttributesDecoder).super_AttributesDecoderInterface._vptr_AttributesDecoderInterface
       = (_func_int **)this_00;
  return (__uniq_ptr_data<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>,_true,_true>
          )(__uniq_ptr_data<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<SequentialAttributeDecoder>
SequentialAttributeDecodersController::CreateSequentialDecoder(
    uint8_t decoder_type) {
  switch (decoder_type) {
    case SEQUENTIAL_ATTRIBUTE_ENCODER_GENERIC:
      return std::unique_ptr<SequentialAttributeDecoder>(
          new SequentialAttributeDecoder());
    case SEQUENTIAL_ATTRIBUTE_ENCODER_INTEGER:
      return std::unique_ptr<SequentialAttributeDecoder>(
          new SequentialIntegerAttributeDecoder());
    case SEQUENTIAL_ATTRIBUTE_ENCODER_QUANTIZATION:
      return std::unique_ptr<SequentialAttributeDecoder>(
          new SequentialQuantizationAttributeDecoder());
#ifdef DRACO_NORMAL_ENCODING_SUPPORTED
    case SEQUENTIAL_ATTRIBUTE_ENCODER_NORMALS:
      return std::unique_ptr<SequentialNormalAttributeDecoder>(
          new SequentialNormalAttributeDecoder());
#endif
    default:
      break;
  }
  // Unknown or unsupported decoder type.
  return nullptr;
}